

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autobondrot.c
# Opt level: O0

void describeXformDB(FILE *outf,xformDatabase *xdb,char *cch)

{
  char *local_60;
  goToRec *local_50;
  goToRec *g;
  biasFunction *f;
  xformAtomRecords *xa;
  transformData *p;
  int slev;
  int n;
  char *cch_local;
  xformDatabase *xdb_local;
  FILE *outf_local;
  
  _slev = cch;
  if (cch == (char *)0x0) {
    _slev = "#";
  }
  if (xdb == (xformDatabase *)0x0) {
    fprintf((FILE *)outf,"NULL xformDatabase\n");
  }
  else {
    p._0_4_ = 0;
    fprintf((FILE *)outf,"%sAUTOBONDROT with %d variables\n",_slev,(ulong)(uint)xdb->nlevs);
    for (xa = (xformAtomRecords *)xdb->xforms; xa != (xformAtomRecords *)0x0; xa = xa->next) {
      if (*(int *)((long)&(xa->loc).z + 4) == 0) {
        fprintf((FILE *)outf,"%s\n",_slev);
      }
      else if ((*(int *)((long)&(xa->loc).z + 4) == 1) || (*(int *)((long)&(xa->loc).z + 4) == 2)) {
        if (*(int *)((long)&(xa->loc).z + 4) == 1) {
          fprintf((FILE *)outf,"%sROT ",_slev);
        }
        else if (*(int *)((long)&(xa->loc).z + 4) == 2) {
          fprintf((FILE *)outf,"%sTRANS ",_slev);
        }
        if ((xa->loc).y == 0.0) {
          local_60 = "";
        }
        else {
          local_60 = (char *)(xa->loc).y;
        }
        fprintf((FILE *)outf,"%s ",local_60);
        fprintf((FILE *)outf,"orig %g scan from %g to %g by %g\n",xa[1].next,xa[1].a,xa[1].loc.x,
                xa[1].loc.y);
        fprintf((FILE *)outf,"%s        AXIS(%g, %g, %g -> %g, %g, %g)\n",xa[2].next,xa[2].a,
                xa[2].loc.x,xa[2].loc.y,xa[2].loc.z,xa[3].next,_slev);
      }
      else if (*(int *)((long)&(xa->loc).z + 4) == 3) {
        p._0_4_ = (uint)p + 1;
        fprintf((FILE *)outf,"%sSAVE transformation (level %d)\n",_slev);
      }
      else if (*(int *)((long)&(xa->loc).z + 4) == 4) {
        fprintf((FILE *)outf,"%sRESTORE transformation (level %d)\n",_slev,(ulong)(uint)p);
        if (0 < (int)(uint)p) {
          p._0_4_ = (uint)p - 1;
        }
      }
      else {
        fprintf((FILE *)outf,"%sUNKNOWN transformation (type %d)\n",_slev,
                (ulong)*(uint *)((long)&(xa->loc).z + 4));
      }
      for (g = (goToRec *)xa[6].loc.x; g != (goToRec *)0x0; g = g->next) {
        if (*(int *)g->level == 0) {
          fprintf((FILE *)outf,"%s        CONST bias function %g\n",g->level[1],_slev);
        }
        else if (*(int *)g->level == 2) {
          fprintf((FILE *)outf,"%s        POLYNOMIAL bias function %g*(x - %g)^%g\n",g->level[1],
                  g->level[2],g->level[3],_slev);
        }
        else if (*(int *)g->level == 1) {
          fprintf((FILE *)outf,"%s        COSINE bias function %g*(%g - cos(%g*(x - %g)))/2\n",
                  g->level[1],g->level[4],g->level[3],g->level[2],_slev);
        }
        else {
          fprintf((FILE *)outf,"%s        UNKNOWN bias function type: %d\n",_slev,
                  (ulong)*(uint *)g->level);
        }
      }
      for (f = (biasFunction *)xa->a; f != (biasFunction *)0x0; f = f->next) {
        fprintf((FILE *)outf,"%s    %4.4s%c%3.3s%2s%4d%c   %8.3f%8.3f%8.3f%6.2f%6.2f      %s\n",f->v
                ,f->ph,f->freq,(double)*(float *)(*(long *)&f->type + 100),
                (double)*(float *)(*(long *)&f->type + 0x68),_slev,*(long *)&f->type + 0x78,
                (ulong)(uint)(int)*(char *)(*(long *)&f->type + 0x7d),
                *(long *)(*(long *)&f->type + 0x70) + 0x35,
                *(long *)(*(long *)&f->type + 0x70) + 0x3b,
                *(undefined4 *)(*(long *)(*(long *)&f->type + 0x70) + 0x20),
                (int)*(char *)(*(long *)(*(long *)&f->type + 0x70) + 0x3a),
                *(long *)(*(long *)&f->type + 0x70) + 0x30);
      }
    }
    p._4_4_ = 0;
    for (local_50 = xdb->golist; local_50 != (goToRec *)0x0; local_50 = local_50->next) {
      p._4_4_ = p._4_4_ + 1;
    }
    fprintf((FILE *)outf,"%sread %d GO statements\n",_slev,(ulong)p._4_4_);
  }
  return;
}

Assistant:

void describeXformDB(FILE *outf, xformDatabase* xdb, char *cch) 
{
   int n = 0, slev = 0;
   transformData *p = NULL;
   xformAtomRecords *xa = NULL;
   biasFunction *f = NULL;
   goToRec *g = NULL;

   if (cch == NULL) { cch = "#"; }

   if (xdb) 
   {/*xdb exists, write comments to .map file*/
      slev = 0;

      fprintf(outf, "%sAUTOBONDROT with %d variables\n", cch, xdb->nlevs);

      for(p = xdb->xforms; p; p = p->next) {
	 if (p->type == NULLxform) {
#ifdef DUMP_EXTRA_XDB_DESCR
	    fprintf(outf, "%sNULL transformation\n", cch);
#else
	    fprintf(outf, "%s\n", cch);
#endif
	 }
	 else if (p->type == ROTxform || p->type == TRANSxform) {
	    if (p->type == ROTxform) {
	       fprintf(outf, "%sROT ", cch);
	    }
	    else if (p->type == TRANSxform) {
	       fprintf(outf, "%sTRANS ", cch);
	    }
	    fprintf(outf, "%s ", ((p->name)?(p->name):""));
#ifdef DUMP_EXTRA_XDB_DESCR
	    fprintf(outf, "orig %g scan from %g to %g by %g (curr %g)\n",
			   p->phase, p->startVal, p->endVal,
			   p->stepVal, p->currVal);
#else
	    fprintf(outf, "orig %g scan from %g to %g by %g\n",
			   p->phase, p->startVal, p->endVal,
			   p->stepVal);
#endif
	    fprintf(outf, "%s        AXIS(%g, %g, %g -> %g, %g, %g)\n", cch,
			   p->a1.x, p->a1.y, p->a1.z,
			   p->a2.x, p->a2.y, p->a2.z);
#ifdef DUMP_EXTRA_XDB_DESCR
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[0][0],
			   p->tmat.element[0][1],
			   p->tmat.element[0][2],
			   p->tmat.element[0][3]);
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[1][0],
			   p->tmat.element[1][1],
			   p->tmat.element[1][2],
			   p->tmat.element[1][3]);
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[2][0],
			   p->tmat.element[2][1],
			   p->tmat.element[2][2],
			   p->tmat.element[2][3]);
	    fprintf(outf, "%s        %12g %12g %12g %12g\n", cch,
			   p->tmat.element[3][0],
			   p->tmat.element[3][1],
			   p->tmat.element[3][2],
			   p->tmat.element[3][3]);
#endif
	 }
	 else if (p->type == SAVExform) {
	    fprintf(outf, "%sSAVE transformation (level %d)\n", cch, ++slev);
	 }
	 else if (p->type == RESTORExform) {
	    fprintf(outf, "%sRESTORE transformation (level %d)\n", cch, slev);
	    if (slev > 0) { slev--; }
	 }
	 else {
	    fprintf(outf, "%sUNKNOWN transformation (type %d)\n", cch, p->type);
	 }
	 for(f = p->funcs; f; f = f->next) {
	    if (f->type == CONSTbiasfunc) {
	       fprintf(outf, "%s        CONST bias function %g\n", cch, f->v);
	    }
	    else if (f->type == POLYbiasfunc) {
	       fprintf(outf, "%s        POLYNOMIAL bias function %g*(x - %g)^%g\n", cch,
					  f->v, f->ph, f->freq);
	    }
	    else if (f->type == COSbiasfunc) {
	       fprintf(outf, "%s        COSINE bias function %g*(%g - cos(%g*(x - %g)))/2\n", cch,
		  f->v, f->shift, f->freq, f->ph);
	    }
	    else {
	       fprintf(outf, "%s        UNKNOWN bias function type: %d\n", cch, f->type);
	    }
	 }

	 for(xa = p->recs; xa; xa = xa->next) {
	    fprintf(outf, "%s    %4.4s%c%3.3s%2s%4d%c   %8.3f%8.3f%8.3f%6.2f%6.2f      %s\n", cch,
	       xa->a->atomname, xa->a->altConf,
	       xa->a->r->resname, xa->a->r->chain,
	       xa->a->r->resid, xa->a->r->resInsCode,
	       xa->loc.x, xa->loc.y, xa->loc.z,
	       xa->a->occ, xa->a->bval, xa->a->r->segid);
	 }
      }
#ifdef DUMP_EXTRA_XDB_DESCR
      for(i = 0; i < MAX_XFORM_LEVELS; i++) {
         if (xdb->level[i]) {
	    fprintf(outf, "%sLevel%d (%s %d)\n", cch, i,
	       ((xdb->level[i]->name)?(xdb->level[i]->name):""),
	       xdb->level[i]->num);
	 }
      }
#endif
      n = 0;
      for(g = xdb->golist; g; g = g->next) {
	 ++n;
#ifdef DUMP_EXTRA_XDB_DESCR
	 fprintf(outf, "%sGO %d", cch, n);
	 for(i = 0; i < xdb->nlevs; i++) {
	    fprintf(outf, ": %g ", g->level[i]);
	 }
	 fprintf(outf, "\n");
#endif
      }
      fprintf(outf, "%sread %d GO statements\n", cch, n);
   }/*xdb exists, write comments to .map file*/
   else 
   {
      fprintf(outf, "NULL xformDatabase\n");
   }
}